

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_socket_peer_id(nng_socket id,uint16_t *idp)

{
  uint16_t uVar1;
  int iVar2;
  nni_sock *local_20;
  nni_sock *sock;
  
  iVar2 = nni_sock_find(&local_20,id.id);
  if (iVar2 == 0) {
    uVar1 = nni_sock_peer_id(local_20);
    *idp = uVar1;
    nni_sock_rele(local_20);
  }
  return iVar2;
}

Assistant:

int
nng_socket_peer_id(nng_socket id, uint16_t *idp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	*idp = nni_sock_peer_id(sock);
	nni_sock_rele(sock);
	return (0);
}